

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::Pattern::visit<slang::ast::DriverVisitor>(Pattern *this,DriverVisitor *visitor)

{
  do {
    if (this->kind != Tagged) {
      (*(code *)(&DAT_00538ef8 + *(int *)(&DAT_00538ef8 + (ulong)this->kind * 4)))();
      return;
    }
    this = (Pattern *)this[1].syntax;
  } while (this != (Pattern *)0x0);
  return;
}

Assistant:

decltype(auto) Pattern::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case PatternKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidPattern);
        CASE(Wildcard, WildcardPattern);
        CASE(Constant, ConstantPattern);
        CASE(Variable, VariablePattern);
        CASE(Tagged, TaggedPattern);
        CASE(Structure, StructurePattern);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}